

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgenfil.cpp
# Opt level: O0

void __thiscall CTcDataStream::write_to_object_file(CTcDataStream *this,CVmFile *fp)

{
  ulong l;
  CTcSymbol *pCVar1;
  size_t sVar2;
  CVmFile *in_RSI;
  CTcDataStream *in_RDI;
  char buf [6];
  size_t cur;
  long cnt;
  CTcStreamAnchor *anchor;
  ulong ofs;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 *p;
  CVmFile *in_stack_ffffffffffffffa0;
  CTcAbsFixup *in_stack_ffffffffffffffa8;
  CVmFile *in_stack_ffffffffffffffb0;
  CVmFile *this_00;
  undefined1 local_36 [14];
  long local_28;
  CTcStreamAnchor *local_20;
  ulong local_18;
  CVmFile *local_10;
  
  local_10 = in_RSI;
  CVmFile::write_uint4(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  for (local_18 = 0; local_18 < in_RDI->ofs_; local_18 = local_36._6_8_ + local_18) {
    local_36._6_8_ = 65000;
    if (in_RDI->ofs_ < local_18 + 65000) {
      local_36._6_8_ = in_RDI->ofs_ - local_18;
    }
    calc_addr(in_RDI,local_18);
    CVmFile::write_bytes
              (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (size_t)in_stack_ffffffffffffffa0);
  }
  local_28 = 0;
  for (local_20 = in_RDI->first_anchor_; local_20 != (CTcStreamAnchor *)0x0;
      local_20 = local_20->nxt_) {
    local_28 = local_28 + 1;
  }
  CVmFile::write_uint4(in_stack_ffffffffffffffa0,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  for (local_20 = in_RDI->first_anchor_; local_20 != (CTcStreamAnchor *)0x0;
      local_20 = local_20->nxt_) {
    this_00 = (CVmFile *)local_36;
    l = CTcStreamAnchor::get_ofs(local_20);
    ::oswp4(this_00,l);
    pCVar1 = CTcStreamAnchor::get_fixup_owner_sym(local_20);
    if (pCVar1 == (CTcSymbol *)0x0) {
      ::oswp2(local_36 + 4,0);
      CVmFile::write_bytes
                (this_00,(char *)in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
    }
    else {
      p = local_36 + 4;
      CTcStreamAnchor::get_fixup_owner_sym(local_20);
      sVar2 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x201ee0);
      ::oswp2(p,(uint)sVar2);
      CVmFile::write_bytes
                (this_00,(char *)in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa0 = local_10;
      CTcStreamAnchor::get_fixup_owner_sym(local_20);
      in_stack_ffffffffffffffa8 = (CTcAbsFixup *)CTcSymbolBase::get_sym((CTcSymbolBase *)0x201f1b);
      CTcStreamAnchor::get_fixup_owner_sym(local_20);
      CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x201f32);
      CVmFile::write_bytes
                (this_00,(char *)in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
    }
    CTcAbsFixup::write_fixup_list_to_object_file(this_00,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void CTcDataStream::write_to_object_file(CVmFile *fp)
{
    ulong ofs;
    CTcStreamAnchor *anchor;
    long cnt;

    /* 
     *   First, write the data stream bytes.  Write the length prefix
     *   followed by the data.  Just blast the whole thing out in one huge
     *   byte stream, one page at a time.  
     */
    fp->write_uint4(ofs_);

    /* write the data one page at a time */
    for (ofs = 0 ; ofs < ofs_ ; )
    {
        size_t cur;

        /* 
         *   write out one whole page, or the balance of the current page if
         *   we have less than a whole page remaining 
         */
        cur = TCCS_PAGE_SIZE;
        if (ofs + cur > ofs_)
            cur = (size_t)(ofs_ - ofs);

        /* write out this chunk */
        fp->write_bytes(calc_addr(ofs), cur);

        /* move to the next page's offset */
        ofs += cur;
    }

    /* count the anchors */
    for (cnt = 0, anchor = first_anchor_ ; anchor != 0 ;
         anchor = anchor->nxt_, ++cnt) ;

    /* write the count */
    fp->write_uint4(cnt);

    /*
     *   Write all of the anchors, and all of their fixups.  (We have the
     *   code to write the anchor and fixup information in-line here for
     *   efficiency - there will normally be a large number of these tiny
     *   objects, so anything we can do to improve the speed of this loop
     *   will help quite a lot in the overall write performance.)  
     */
    for (anchor = first_anchor_ ; anchor != 0 ; anchor = anchor->nxt_)
    {
        char buf[6];

        /* write the stream offset */
        oswp4(buf, anchor->get_ofs());

        /* 
         *   If the anchor has an external fixup list, write the symbol's
         *   name to the file; otherwise write a zero length to indicate that
         *   we have an internal fixup list.  
         */
        if (anchor->get_fixup_owner_sym() == 0)
        {
            /* no external list - indicate with a zero symbol length */
            oswp2(buf+4, 0);
            fp->write_bytes(buf, 6);
        }
        else
        {
            /* external list - write the symbol length and name */
            oswp2(buf+4, anchor->get_fixup_owner_sym()->get_sym_len());
            fp->write_bytes(buf, 6);
            fp->write_bytes(anchor->get_fixup_owner_sym()->get_sym(),
                            anchor->get_fixup_owner_sym()->get_sym_len());
        }

        /* write the fixup list */
        CTcAbsFixup::
            write_fixup_list_to_object_file(fp, *anchor->fixup_list_head_);
    }
}